

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::to_rerolled_array_expression
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *parent_type,string *base_expr
          ,SPIRType *type)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t id;
  SPIRType *pSVar3;
  char (*in_R9) [2];
  bool local_259;
  string local_258;
  spirv_cross local_238 [32];
  string local_218;
  string local_1f8;
  undefined1 local_1d8 [8];
  string subexpr;
  uint32_t i;
  SPIRType *parent;
  uint32_t size;
  undefined1 local_198 [8];
  SPIRType tmp_type;
  bool remapped_boolean;
  SPIRType *type_local;
  string *base_expr_local;
  SPIRType *parent_type_local;
  CompilerGLSL *this_local;
  string *expr;
  
  local_259 = false;
  if ((parent_type->basetype == Struct) && (local_259 = false, type->basetype == Boolean)) {
    local_259 = (this->backend).boolean_in_struct_remapped_type != Boolean;
  }
  tmp_type.member_name_cache._M_h._M_single_bucket._7_1_ = local_259;
  SPIRType::SPIRType((SPIRType *)local_198,OpNop);
  if ((tmp_type.member_name_cache._M_h._M_single_bucket._7_1_ & 1) == 0) {
    if ((type->basetype == Boolean) && ((this->backend).boolean_in_struct_remapped_type != Boolean))
    {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->parent_type);
      pSVar3 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
      SPIRType::operator=((SPIRType *)local_198,pSVar3);
      tmp_type.member_name_cache._M_h._M_single_bucket._7_1_ = 1;
    }
  }
  else {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->parent_type);
    pSVar3 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
    SPIRType::operator=((SPIRType *)local_198,pSVar3);
    tmp_type.super_IVariant.self.id = (this->backend).boolean_in_struct_remapped_type;
  }
  uVar2 = to_array_size_literal(this,type);
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->parent_type);
  pSVar3 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,id);
  subexpr.field_2._M_local_buf[0xf] = '\0';
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)__return_storage_ptr__,"{ ",(allocator *)(subexpr.field_2._M_local_buf + 0xe)
            );
  ::std::allocator<char>::~allocator((allocator<char> *)(subexpr.field_2._M_local_buf + 0xe));
  for (subexpr.field_2._8_4_ = 0; (uint)subexpr.field_2._8_4_ < uVar2;
      subexpr.field_2._8_4_ = subexpr.field_2._8_4_ + 1) {
    convert_to_string<unsigned_int,_0>(&local_1f8,(uint *)(subexpr.field_2._M_local_buf + 8));
    join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              ((string *)local_1d8,(spirv_cross *)base_expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5978ea,
               (char (*) [2])&local_1f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5977ef,in_R9);
    ::std::__cxx11::string::~string((string *)&local_1f8);
    bVar1 = Compiler::is_array(&this->super_Compiler,pSVar3);
    if (bVar1) {
      to_rerolled_array_expression(&local_258,this,parent_type,(string *)local_1d8,pSVar3);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_258);
      ::std::__cxx11::string::~string((string *)&local_258);
    }
    else {
      if ((tmp_type.member_name_cache._M_h._M_single_bucket._7_1_ & 1) != 0) {
        (*(this->super_Compiler)._vptr_Compiler[0x13])(local_238,this,local_198,0);
        join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                  (&local_218,local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5ac375,
                   (char (*) [2])local_1d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5b7d4b,
                   in_R9);
        ::std::__cxx11::string::operator=((string *)local_1d8,(string *)&local_218);
        ::std::__cxx11::string::~string((string *)&local_218);
        ::std::__cxx11::string::~string((string *)local_238);
      }
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_1d8);
    }
    if (subexpr.field_2._8_4_ + 1 < uVar2) {
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    }
    ::std::__cxx11::string::~string((string *)local_1d8);
  }
  ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__," }");
  subexpr.field_2._M_local_buf[0xf] = '\x01';
  SPIRType::~SPIRType((SPIRType *)local_198);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_rerolled_array_expression(const SPIRType &parent_type,
                                                  const string &base_expr, const SPIRType &type)
{
	bool remapped_boolean = parent_type.basetype == SPIRType::Struct &&
	                        type.basetype == SPIRType::Boolean &&
	                        backend.boolean_in_struct_remapped_type != SPIRType::Boolean;

	SPIRType tmp_type { OpNop };
	if (remapped_boolean)
	{
		tmp_type = get<SPIRType>(type.parent_type);
		tmp_type.basetype = backend.boolean_in_struct_remapped_type;
	}
	else if (type.basetype == SPIRType::Boolean && backend.boolean_in_struct_remapped_type != SPIRType::Boolean)
	{
		// It's possible that we have an r-value expression that was OpLoaded from a struct.
		// We have to reroll this and explicitly cast the input to bool, because the r-value is short.
		tmp_type = get<SPIRType>(type.parent_type);
		remapped_boolean = true;
	}

	uint32_t size = to_array_size_literal(type);
	auto &parent = get<SPIRType>(type.parent_type);
	string expr = "{ ";

	for (uint32_t i = 0; i < size; i++)
	{
		auto subexpr = join(base_expr, "[", convert_to_string(i), "]");
		if (!is_array(parent))
		{
			if (remapped_boolean)
				subexpr = join(type_to_glsl(tmp_type), "(", subexpr, ")");
			expr += subexpr;
		}
		else
			expr += to_rerolled_array_expression(parent_type, subexpr, parent);

		if (i + 1 < size)
			expr += ", ";
	}

	expr += " }";
	return expr;
}